

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::ChildPopper::visitStackSwitch
          (Result<wasm::Ok> *__return_storage_ptr__,ChildPopper *this,StackSwitch *curr,
          optional<wasm::HeapType> ct)

{
  optional<wasm::HeapType> ct_00;
  undefined4 uStack_80;
  ConstraintCollector local_68;
  undefined1 local_48 [8];
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  children;
  StackSwitch *curr_local;
  ChildPopper *this_local;
  optional<wasm::HeapType> ct_local;
  
  children.
  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  std::
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::vector((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
            *)local_48);
  ConstraintCollector::ConstraintCollector
            (&local_68,this->builder,
             (vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
              *)local_48);
  uStack_80 = (undefined4)
              CONCAT71(ct_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_,
                       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_engaged);
  ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_4_ = uStack_80;
  ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch
            (&local_68.super_ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>,
             (StackSwitch *)
             children.
             super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,ct_00);
  popConstrainedChildren
            (__return_storage_ptr__,this,
             (vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
              *)local_48);
  std::
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::~vector((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
             *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<> visitStackSwitch(StackSwitch* curr,
                            std::optional<HeapType> ct = std::nullopt) {
    std::vector<Child> children;
    ConstraintCollector{builder, children}.visitStackSwitch(curr, ct);
    return popConstrainedChildren(children);
  }